

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_send.c
# Opt level: O2

ares_status_t
ares_send_nolock(ares_channel_t *channel,ares_server_t *server,ares_send_flags_t flags,
                ares_dns_record_t *dnsrec,ares_callback_dnsrec callback,void *arg,
                unsigned_short *qid)

{
  ares_server_t *requested_server;
  unsigned_short id;
  ares_bool_t aVar1;
  ares_status_t aVar2;
  ares_status_t aVar3;
  size_t sVar4;
  ares_query_t *query;
  ares_llist_node_t *paVar5;
  ares_dns_record_t *paVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ares_dns_record_t **dest;
  size_t sVar10;
  ulong uVar11;
  ares_dns_record_t *dnsrec_resp;
  char *name;
  ares_dns_record_t *local_178;
  ares_server_t *local_170;
  ares_timeval_t now;
  byte local_158 [32];
  char dns0x20name [256];
  
  do {
    id = ares_generate_new_id(channel->rand_state);
    aVar1 = ares_htable_szvp_get(channel->queries_by_qid,(ulong)id,(void **)0x0);
  } while (aVar1 != ARES_FALSE);
  dnsrec_resp = (ares_dns_record_t *)0x0;
  ares_tvnow(&now);
  sVar4 = ares_slist_len(channel->servers);
  if (sVar4 == 0) {
    aVar2 = ARES_ENOSERVER;
    paVar6 = (ares_dns_record_t *)0x0;
LAB_0011547b:
    (*callback)(arg,aVar2,0,paVar6);
    return aVar2;
  }
  local_170 = server;
  if (((flags & ARES_SEND_FLAG_NOCACHE) == 0) &&
     (aVar2 = ares_qcache_fetch(channel,&now,dnsrec,&dnsrec_resp), paVar6 = dnsrec_resp,
     aVar2 != ARES_ENOTFOUND)) goto LAB_0011547b;
  query = (ares_query_t *)ares_malloc(0x90);
  if (query == (ares_query_t *)0x0) {
    aVar2 = ARES_ENOMEM;
LAB_0011545a:
    (*callback)(arg,aVar2,0,(ares_dns_record_t *)0x0);
    return aVar2;
  }
  memset(query,0,0x90);
  query->channel = channel;
  query->qid = id;
  (query->timeout).usec = 0;
  query->using_tcp = channel->flags & ARES_TRUE;
  dest = &query->query;
  aVar3 = ares_dns_record_duplicate_ex(dest,dnsrec);
  if (aVar3 != ARES_SUCCESS) {
    aVar2 = ARES_EBADQUERY;
    if (aVar3 != ARES_EBADRESP) {
      aVar2 = aVar3;
    }
    ares_free(query);
    goto LAB_0011545a;
  }
  ares_dns_record_set_id(*dest,id);
  if (((channel->flags & 0x400) != 0) && (query->using_tcp == ARES_FALSE)) {
    paVar6 = *dest;
    name = (char *)0x0;
    aVar2 = ares_dns_record_query_get
                      (paVar6,0,&name,(ares_dns_rec_type_t *)0x0,(ares_dns_class_t *)0x0);
    if (aVar2 != ARES_SUCCESS) goto LAB_00115565;
    sVar4 = ares_strlen(name);
    if (sVar4 != 0) {
      if (0xff < sVar4) {
        aVar2 = ARES_EBADNAME;
        goto LAB_00115565;
      }
      local_178 = paVar6;
      memset(dns0x20name,0,0x100);
      uVar11 = (ulong)((uint)(sVar4 + 7) & 0x1f8);
      ares_rand_bytes(channel->rand_state,local_158,sVar4 + 7 >> 3);
      uVar7 = uVar11;
      for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
        bVar8 = name[sVar10];
        if ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a) {
          uVar9 = uVar11 - uVar7;
          bVar8 = ((local_158[uVar9 >> 3] >> ((uint)uVar9 & 7) & 1) != 0) << 5 | bVar8 & 0xdf;
          uVar7 = uVar7 - 1;
        }
        dns0x20name[sVar10] = bVar8;
      }
      aVar2 = ares_dns_record_query_set_name(local_178,0,dns0x20name);
      if (aVar2 != ARES_SUCCESS) goto LAB_00115565;
    }
  }
  query->callback = callback;
  query->arg = arg;
  query->try_count = 0;
  if ((flags & ARES_SEND_FLAG_NORETRY) != 0) {
    query->no_retries = ARES_TRUE;
  }
  query->error_status = ARES_SUCCESS;
  query->timeouts = 0;
  query->node_queries_by_timeout = (ares_slist_node_t *)0x0;
  query->node_queries_to_conn = (ares_llist_node_t *)0x0;
  paVar5 = ares_llist_insert_last(channel->all_queries,query);
  requested_server = local_170;
  query->node_all_queries = paVar5;
  if ((paVar5 != (ares_llist_node_t *)0x0) &&
     (aVar1 = ares_htable_szvp_insert(channel->queries_by_qid,(ulong)query->qid,query),
     aVar1 != ARES_FALSE)) {
    aVar2 = ares_send_query(requested_server,query,&now);
    if (qid == (unsigned_short *)0x0 || aVar2 != ARES_SUCCESS) {
      return aVar2;
    }
    *qid = id;
    return ARES_SUCCESS;
  }
  aVar2 = ARES_ENOMEM;
LAB_00115565:
  (*callback)(arg,aVar2,0,(ares_dns_record_t *)0x0);
  ares_free_query(query);
  return aVar2;
}

Assistant:

ares_status_t ares_send_nolock(ares_channel_t *channel, ares_server_t *server,
                               ares_send_flags_t        flags,
                               const ares_dns_record_t *dnsrec,
                               ares_callback_dnsrec callback, void *arg,
                               unsigned short *qid)
{
  ares_query_t            *query;
  ares_timeval_t           now;
  ares_status_t            status;
  unsigned short           id          = generate_unique_qid(channel);
  const ares_dns_record_t *dnsrec_resp = NULL;

  ares_tvnow(&now);

  if (ares_slist_len(channel->servers) == 0) {
    callback(arg, ARES_ENOSERVER, 0, NULL);
    return ARES_ENOSERVER;
  }

  if (!(flags & ARES_SEND_FLAG_NOCACHE)) {
    /* Check query cache */
    status = ares_qcache_fetch(channel, &now, dnsrec, &dnsrec_resp);
    if (status != ARES_ENOTFOUND) {
      /* ARES_SUCCESS means we retrieved the cache, anything else is a critical
       * failure, all result in termination */
      callback(arg, status, 0, dnsrec_resp);
      return status;
    }
  }

  /* Allocate space for query and allocated fields. */
  query = ares_malloc(sizeof(ares_query_t));
  if (!query) {
    callback(arg, ARES_ENOMEM, 0, NULL); /* LCOV_EXCL_LINE: OutOfMemory */
    return ARES_ENOMEM;                  /* LCOV_EXCL_LINE: OutOfMemory */
  }
  memset(query, 0, sizeof(*query));

  query->channel      = channel;
  query->qid          = id;
  query->timeout.sec  = 0;
  query->timeout.usec = 0;
  query->using_tcp =
    (channel->flags & ARES_FLAG_USEVC) ? ARES_TRUE : ARES_FALSE;

  /* Duplicate Query */
  status = ares_dns_record_duplicate_ex(&query->query, dnsrec);
  if (status != ARES_SUCCESS) {
    /* Sometimes we might get a EBADRESP response from duplicate due to
     * the way it works (write and parse), rewrite it to EBADQUERY. */
    if (status == ARES_EBADRESP) {
      status = ARES_EBADQUERY;
    }
    ares_free(query);
    callback(arg, status, 0, NULL);
    return status;
  }

  ares_dns_record_set_id(query->query, id);

  if (channel->flags & ARES_FLAG_DNS0x20 && !query->using_tcp) {
    status = ares_apply_dns0x20(channel, query->query);
    if (status != ARES_SUCCESS) {
      /* LCOV_EXCL_START: OutOfMemory */
      callback(arg, status, 0, NULL);
      ares_free_query(query);
      return status;
      /* LCOV_EXCL_STOP */
    }
  }

  /* Fill in query arguments. */
  query->callback = callback;
  query->arg      = arg;

  /* Initialize query status. */
  query->try_count = 0;

  if (flags & ARES_SEND_FLAG_NORETRY) {
    query->no_retries = ARES_TRUE;
  }

  query->error_status = ARES_SUCCESS;
  query->timeouts     = 0;

  /* Initialize our list nodes. */
  query->node_queries_by_timeout = NULL;
  query->node_queries_to_conn    = NULL;

  /* Chain the query into the list of all queries. */
  query->node_all_queries = ares_llist_insert_last(channel->all_queries, query);
  if (query->node_all_queries == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    callback(arg, ARES_ENOMEM, 0, NULL);
    ares_free_query(query);
    return ARES_ENOMEM;
    /* LCOV_EXCL_STOP */
  }

  /* Keep track of queries bucketed by qid, so we can process DNS
   * responses quickly.
   */
  if (!ares_htable_szvp_insert(channel->queries_by_qid, query->qid, query)) {
    /* LCOV_EXCL_START: OutOfMemory */
    callback(arg, ARES_ENOMEM, 0, NULL);
    ares_free_query(query);
    return ARES_ENOMEM;
    /* LCOV_EXCL_STOP */
  }

  /* Perform the first query action. */

  status = ares_send_query(server, query, &now);
  if (status == ARES_SUCCESS && qid) {
    *qid = id;
  }
  return status;
}